

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  RTCIntersectArguments *pRVar62;
  Scene *pSVar63;
  ulong *puVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar84;
  float fVar86;
  undefined1 auVar79 [32];
  float fVar81;
  float fVar83;
  float fVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar80 [32];
  float fVar90;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  float fVar99;
  float fVar102;
  float fVar104;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar100;
  float fVar101;
  float fVar103;
  undefined1 auVar96 [64];
  float fVar105;
  float fVar110;
  float fVar111;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar112;
  undefined1 auVar108 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [64];
  float fVar116;
  float fVar117;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar122 [64];
  float fVar135;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  float fVar145;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar148 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar163 [64];
  float fVar176;
  float fVar177;
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar179 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar197 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_d4c;
  Scene *local_d48;
  undefined1 local_d40 [32];
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  long local_c70;
  long local_c68;
  undefined8 local_c60;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined4 local_c40;
  float local_c3c;
  float local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  uint local_c28;
  uint local_c24;
  uint local_c20;
  RTCFilterFunctionNArguments local_c10;
  undefined1 local_be0 [32];
  undefined8 local_bc0;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800 [250];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar105 = ray->tfar;
    if (0.0 <= fVar105) {
      puVar64 = local_800 + 1;
      aVar2 = (ray->dir).field_0;
      auVar68 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx((undefined1  [16])aVar2,auVar69);
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar69,auVar118,1);
      auVar119._8_4_ = 0x3f800000;
      auVar119._0_8_ = 0x3f8000003f800000;
      auVar119._12_4_ = 0x3f800000;
      auVar118 = vdivps_avx(auVar119,(undefined1  [16])aVar2);
      auVar120._8_4_ = 0x5d5e0b6b;
      auVar120._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar120._12_4_ = 0x5d5e0b6b;
      auVar69 = vblendvps_avx(auVar118,auVar120,auVar69);
      auVar106._0_4_ = auVar69._0_4_ * 0.99999964;
      auVar106._4_4_ = auVar69._4_4_ * 0.99999964;
      auVar106._8_4_ = auVar69._8_4_ * 0.99999964;
      auVar106._12_4_ = auVar69._12_4_ * 0.99999964;
      auVar91._0_4_ = auVar69._0_4_ * 1.0000004;
      auVar91._4_4_ = auVar69._4_4_ * 1.0000004;
      auVar91._8_4_ = auVar69._8_4_ * 1.0000004;
      auVar91._12_4_ = auVar69._12_4_ * 1.0000004;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_c80._4_4_ = uVar1;
      local_c80._0_4_ = uVar1;
      local_c80._8_4_ = uVar1;
      local_c80._12_4_ = uVar1;
      auVar148 = ZEXT1664(local_c80);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_c90._4_4_ = uVar1;
      local_c90._0_4_ = uVar1;
      local_c90._8_4_ = uVar1;
      local_c90._12_4_ = uVar1;
      auVar156 = ZEXT1664(local_c90);
      local_ca0 = vshufps_avx(auVar106,auVar106,0);
      auVar158 = ZEXT1664(local_ca0);
      auVar69 = vmovshdup_avx(auVar106);
      local_cb0 = vshufps_avx(auVar106,auVar106,0x55);
      auVar160 = ZEXT1664(local_cb0);
      auVar118 = vshufpd_avx(auVar106,auVar106,1);
      local_cc0 = vshufps_avx(auVar106,auVar106,0xaa);
      auVar109 = ZEXT1664(local_cc0);
      local_cd0 = vshufps_avx(auVar91,auVar91,0);
      auVar163 = ZEXT1664(local_cd0);
      local_ce0 = vshufps_avx(auVar91,auVar91,0x55);
      auVar179 = ZEXT1664(local_ce0);
      uVar65 = (ulong)(auVar106._0_4_ < 0.0) << 4;
      uVar61 = (ulong)(auVar69._0_4_ < 0.0) << 4 | 0x20;
      local_cf0 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar96 = ZEXT1664(local_cf0);
      uVar66 = (ulong)(auVar118._0_4_ < 0.0) << 4 | 0x40;
      uVar67 = uVar65 ^ 0x10;
      local_d00 = vshufps_avx(auVar68,auVar68,0);
      auVar122 = ZEXT1664(local_d00);
      local_d10 = vshufps_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),0);
      auVar138 = ZEXT1664(local_d10);
      local_ae0._16_16_ = mm_lookupmask_ps._240_16_;
      local_ae0._0_16_ = mm_lookupmask_ps._0_16_;
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = 0x3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar79._16_4_ = 0x3f800000;
      auVar79._20_4_ = 0x3f800000;
      auVar79._24_4_ = 0x3f800000;
      auVar79._28_4_ = 0x3f800000;
      auVar70._8_4_ = 0xbf800000;
      auVar70._0_8_ = 0xbf800000bf800000;
      auVar70._12_4_ = 0xbf800000;
      auVar70._16_4_ = 0xbf800000;
      auVar70._20_4_ = 0xbf800000;
      auVar70._24_4_ = 0xbf800000;
      auVar70._28_4_ = 0xbf800000;
      _local_b00 = vblendvps_avx(auVar79,auVar70,local_ae0);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_d20._4_4_ = uVar1;
      local_d20._0_4_ = uVar1;
      local_d20._8_4_ = uVar1;
      local_d20._12_4_ = uVar1;
      auVar194 = ZEXT1664(local_d20);
LAB_00b78d08:
      if (puVar64 != local_800) {
        uVar60 = puVar64[-1];
        puVar64 = puVar64 + -1;
        while ((uVar60 & 8) == 0) {
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar65),auVar148._0_16_);
          auVar68._0_4_ = auVar158._0_4_ * auVar69._0_4_;
          auVar68._4_4_ = auVar158._4_4_ * auVar69._4_4_;
          auVar68._8_4_ = auVar158._8_4_ * auVar69._8_4_;
          auVar68._12_4_ = auVar158._12_4_ * auVar69._12_4_;
          auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar61),auVar156._0_16_);
          auVar72._0_4_ = auVar160._0_4_ * auVar69._0_4_;
          auVar72._4_4_ = auVar160._4_4_ * auVar69._4_4_;
          auVar72._8_4_ = auVar160._8_4_ * auVar69._8_4_;
          auVar72._12_4_ = auVar160._12_4_ * auVar69._12_4_;
          auVar69 = vmaxps_avx(auVar68,auVar72);
          auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar66),auVar194._0_16_);
          auVar73._0_4_ = auVar109._0_4_ * auVar118._0_4_;
          auVar73._4_4_ = auVar109._4_4_ * auVar118._4_4_;
          auVar73._8_4_ = auVar109._8_4_ * auVar118._8_4_;
          auVar73._12_4_ = auVar109._12_4_ * auVar118._12_4_;
          auVar118 = vmaxps_avx(auVar73,auVar122._0_16_);
          auVar69 = vmaxps_avx(auVar69,auVar118);
          auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar67),auVar148._0_16_);
          auVar74._0_4_ = auVar163._0_4_ * auVar118._0_4_;
          auVar74._4_4_ = auVar163._4_4_ * auVar118._4_4_;
          auVar74._8_4_ = auVar163._8_4_ * auVar118._8_4_;
          auVar74._12_4_ = auVar163._12_4_ * auVar118._12_4_;
          auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar61 ^ 0x10)),
                                auVar156._0_16_);
          auVar77._0_4_ = auVar179._0_4_ * auVar118._0_4_;
          auVar77._4_4_ = auVar179._4_4_ * auVar118._4_4_;
          auVar77._8_4_ = auVar179._8_4_ * auVar118._8_4_;
          auVar77._12_4_ = auVar179._12_4_ * auVar118._12_4_;
          auVar118 = vminps_avx(auVar74,auVar77);
          auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar66 ^ 0x10)),
                               auVar194._0_16_);
          auVar78._0_4_ = auVar96._0_4_ * auVar68._0_4_;
          auVar78._4_4_ = auVar96._4_4_ * auVar68._4_4_;
          auVar78._8_4_ = auVar96._8_4_ * auVar68._8_4_;
          auVar78._12_4_ = auVar96._12_4_ * auVar68._12_4_;
          auVar68 = vminps_avx(auVar78,auVar138._0_16_);
          auVar118 = vminps_avx(auVar118,auVar68);
          auVar69 = vcmpps_avx(auVar69,auVar118,2);
          uVar56 = vmovmskps_avx(auVar69);
          if (uVar56 == 0) goto LAB_00b78d08;
          uVar56 = uVar56 & 0xff;
          uVar57 = uVar60 & 0xfffffffffffffff0;
          lVar9 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar60 = *(ulong *)(uVar57 + lVar9 * 8);
          uVar56 = uVar56 - 1 & uVar56;
          uVar59 = (ulong)uVar56;
          if (uVar56 != 0) {
            do {
              *puVar64 = uVar60;
              puVar64 = puVar64 + 1;
              lVar9 = 0;
              if (uVar59 != 0) {
                for (; (uVar59 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              uVar60 = *(ulong *)(uVar57 + lVar9 * 8);
              uVar59 = uVar59 - 1 & uVar59;
            } while (uVar59 != 0);
          }
        }
        local_c68 = (ulong)((uint)uVar60 & 0xf) - 8;
        uVar60 = uVar60 & 0xfffffffffffffff0;
        for (local_c70 = 0; local_c70 != local_c68; local_c70 = local_c70 + 1) {
          lVar58 = local_c70 * 0x60;
          pSVar63 = context->scene;
          local_d48 = pSVar63;
          ppfVar3 = (pSVar63->vertices).items;
          pfVar4 = ppfVar3[*(uint *)(uVar60 + 0x40 + lVar58)];
          pfVar5 = ppfVar3[*(uint *)(uVar60 + 0x44 + lVar58)];
          pfVar6 = ppfVar3[*(uint *)(uVar60 + 0x48 + lVar58)];
          pfVar7 = ppfVar3[*(uint *)(uVar60 + 0x4c + lVar58)];
          auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar60 + lVar58)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar60 + 8 + lVar58)));
          auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar60 + lVar58)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar60 + 8 + lVar58)));
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar60 + 4 + lVar58)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0xc + lVar58)))
          ;
          auVar118 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar60 + 4 + lVar58)),
                                   *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0xc + lVar58))
                                  );
          auVar119 = vunpcklps_avx(auVar69,auVar118);
          auVar120 = vunpcklps_avx(auVar68,auVar91);
          auVar69 = vunpckhps_avx(auVar68,auVar91);
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar60 + 0x10 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x18 + lVar58)));
          auVar118 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar60 + 0x10 + lVar58)),
                                   *(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x18 + lVar58)));
          auVar106 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar60 + 0x14 + lVar58)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar60 + 0x1c + lVar58)));
          auVar68 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar60 + 0x14 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar60 + 0x1c + lVar58)));
          auVar72 = vunpcklps_avx(auVar118,auVar68);
          auVar73 = vunpcklps_avx(auVar91,auVar106);
          auVar118 = vunpckhps_avx(auVar91,auVar106);
          auVar106 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar60 + 0x20 + lVar58)),
                                   *(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x28 + lVar58)));
          auVar68 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar60 + 0x20 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x28 + lVar58)));
          auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar60 + 0x24 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar60 + 0x2c + lVar58)));
          auVar91 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar60 + 0x24 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar60 + 0x2c + lVar58)));
          auVar77 = vunpcklps_avx(auVar68,auVar91);
          auVar78 = vunpcklps_avx(auVar106,auVar74);
          auVar68 = vunpckhps_avx(auVar106,auVar74);
          auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar60 + 0x30 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x38 + lVar58)));
          auVar91 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar60 + 0x30 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x38 + lVar58)));
          auVar26 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar60 + 0x34 + lVar58))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar60 + 0x3c + lVar58)));
          auVar106 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar60 + 0x34 + lVar58)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar60 + 0x3c + lVar58)));
          auVar106 = vunpcklps_avx(auVar91,auVar106);
          auVar27 = vunpcklps_avx(auVar74,auVar26);
          lVar9 = uVar60 + 0x40 + lVar58;
          local_9e0 = *(undefined8 *)(lVar9 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar9 + 0x18);
          auVar91 = vunpckhps_avx(auVar74,auVar26);
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          lVar58 = uVar60 + 0x50 + lVar58;
          local_a00 = *(undefined8 *)(lVar58 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar58 + 0x18);
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar197._16_16_ = auVar78;
          auVar197._0_16_ = auVar120;
          auVar146._16_16_ = auVar68;
          auVar146._0_16_ = auVar69;
          auVar71._16_16_ = auVar77;
          auVar71._0_16_ = auVar119;
          auVar107._16_16_ = auVar73;
          auVar107._0_16_ = auVar73;
          auVar121._16_16_ = auVar118;
          auVar121._0_16_ = auVar118;
          auVar75._16_16_ = auVar72;
          auVar75._0_16_ = auVar72;
          auVar157._16_16_ = auVar27;
          auVar157._0_16_ = auVar27;
          auVar159._16_16_ = auVar91;
          auVar159._0_16_ = auVar91;
          auVar92._16_16_ = auVar106;
          auVar92._0_16_ = auVar106;
          uVar1 = *(undefined4 *)&(ray->org).field_0;
          auVar178._4_4_ = uVar1;
          auVar178._0_4_ = uVar1;
          auVar178._8_4_ = uVar1;
          auVar178._12_4_ = uVar1;
          auVar178._16_4_ = uVar1;
          auVar178._20_4_ = uVar1;
          auVar178._24_4_ = uVar1;
          auVar178._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar192._4_4_ = uVar1;
          auVar192._0_4_ = uVar1;
          auVar192._8_4_ = uVar1;
          auVar192._12_4_ = uVar1;
          auVar192._16_4_ = uVar1;
          auVar192._20_4_ = uVar1;
          auVar192._24_4_ = uVar1;
          auVar192._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar193._4_4_ = uVar1;
          auVar193._0_4_ = uVar1;
          auVar193._8_4_ = uVar1;
          auVar193._12_4_ = uVar1;
          auVar193._16_4_ = uVar1;
          auVar193._20_4_ = uVar1;
          auVar193._24_4_ = uVar1;
          auVar193._28_4_ = uVar1;
          local_b20 = vsubps_avx(auVar197,auVar178);
          local_b40 = vsubps_avx(auVar146,auVar192);
          local_b60 = vsubps_avx(auVar71,auVar193);
          auVar70 = vsubps_avx(auVar107,auVar178);
          auVar79 = vsubps_avx(auVar121,auVar192);
          auVar19 = vsubps_avx(auVar75,auVar193);
          auVar71 = vsubps_avx(auVar157,auVar178);
          auVar20 = vsubps_avx(auVar159,auVar192);
          auVar21 = vsubps_avx(auVar92,auVar193);
          local_b80 = vsubps_avx(auVar71,local_b20);
          local_ba0 = vsubps_avx(auVar20,local_b40);
          local_a20 = vsubps_avx(auVar21,local_b60);
          fVar195 = local_b40._0_4_;
          fVar105 = fVar195 + auVar20._0_4_;
          fVar198 = local_b40._4_4_;
          fVar110 = fVar198 + auVar20._4_4_;
          fVar200 = local_b40._8_4_;
          fVar111 = fVar200 + auVar20._8_4_;
          fVar202 = local_b40._12_4_;
          fVar112 = fVar202 + auVar20._12_4_;
          fVar204 = local_b40._16_4_;
          fVar113 = fVar204 + auVar20._16_4_;
          fVar206 = local_b40._20_4_;
          fVar114 = fVar206 + auVar20._20_4_;
          fVar208 = local_b40._24_4_;
          fVar115 = fVar208 + auVar20._24_4_;
          fVar82 = local_b40._28_4_;
          fVar10 = local_b60._0_4_;
          fVar116 = auVar21._0_4_ + fVar10;
          fVar12 = local_b60._4_4_;
          fVar123 = auVar21._4_4_ + fVar12;
          fVar14 = local_b60._8_4_;
          fVar125 = auVar21._8_4_ + fVar14;
          fVar81 = local_b60._12_4_;
          fVar127 = auVar21._12_4_ + fVar81;
          fVar85 = local_b60._16_4_;
          fVar129 = auVar21._16_4_ + fVar85;
          fVar89 = local_b60._20_4_;
          fVar131 = auVar21._20_4_ + fVar89;
          fVar17 = local_b60._24_4_;
          fVar133 = auVar21._24_4_ + fVar17;
          fVar135 = local_a20._0_4_;
          fVar139 = local_a20._4_4_;
          auVar22._4_4_ = fVar139 * fVar110;
          auVar22._0_4_ = fVar135 * fVar105;
          fVar140 = local_a20._8_4_;
          auVar22._8_4_ = fVar140 * fVar111;
          fVar141 = local_a20._12_4_;
          auVar22._12_4_ = fVar141 * fVar112;
          fVar142 = local_a20._16_4_;
          auVar22._16_4_ = fVar142 * fVar113;
          fVar143 = local_a20._20_4_;
          auVar22._20_4_ = fVar143 * fVar114;
          fVar144 = local_a20._24_4_;
          auVar22._24_4_ = fVar144 * fVar115;
          auVar22._28_4_ = auVar68._12_4_;
          fVar176 = local_ba0._0_4_;
          fVar180 = local_ba0._4_4_;
          auVar23._4_4_ = fVar180 * fVar123;
          auVar23._0_4_ = fVar176 * fVar116;
          fVar182 = local_ba0._8_4_;
          auVar23._8_4_ = fVar182 * fVar125;
          fVar184 = local_ba0._12_4_;
          auVar23._12_4_ = fVar184 * fVar127;
          fVar186 = local_ba0._16_4_;
          auVar23._16_4_ = fVar186 * fVar129;
          fVar188 = local_ba0._20_4_;
          auVar23._20_4_ = fVar188 * fVar131;
          fVar190 = local_ba0._24_4_;
          auVar23._24_4_ = fVar190 * fVar133;
          auVar23._28_4_ = auVar27._12_4_;
          auVar22 = vsubps_avx(auVar23,auVar22);
          fVar11 = local_b20._0_4_;
          fVar145 = auVar71._0_4_ + fVar11;
          fVar13 = local_b20._4_4_;
          fVar149 = auVar71._4_4_ + fVar13;
          fVar15 = local_b20._8_4_;
          fVar150 = auVar71._8_4_ + fVar15;
          fVar83 = local_b20._12_4_;
          fVar151 = auVar71._12_4_ + fVar83;
          fVar87 = local_b20._16_4_;
          fVar152 = auVar71._16_4_ + fVar87;
          fVar16 = local_b20._20_4_;
          fVar153 = auVar71._20_4_ + fVar16;
          fVar18 = local_b20._24_4_;
          fVar154 = auVar71._24_4_ + fVar18;
          fVar90 = local_b80._0_4_;
          fVar97 = local_b80._4_4_;
          auVar24._4_4_ = fVar97 * fVar123;
          auVar24._0_4_ = fVar90 * fVar116;
          fVar98 = local_b80._8_4_;
          auVar24._8_4_ = fVar98 * fVar125;
          fVar99 = local_b80._12_4_;
          auVar24._12_4_ = fVar99 * fVar127;
          fVar100 = local_b80._16_4_;
          auVar24._16_4_ = fVar100 * fVar129;
          fVar101 = local_b80._20_4_;
          auVar24._20_4_ = fVar101 * fVar131;
          fVar103 = local_b80._24_4_;
          auVar24._24_4_ = fVar103 * fVar133;
          auVar24._28_4_ = auVar21._28_4_ + local_b60._28_4_;
          auVar75 = local_a20;
          auVar25._4_4_ = fVar139 * fVar149;
          auVar25._0_4_ = fVar135 * fVar145;
          auVar25._8_4_ = fVar140 * fVar150;
          auVar25._12_4_ = fVar141 * fVar151;
          auVar25._16_4_ = fVar142 * fVar152;
          auVar25._20_4_ = fVar143 * fVar153;
          auVar25._24_4_ = fVar144 * fVar154;
          auVar25._28_4_ = auVar91._12_4_;
          auVar23 = vsubps_avx(auVar25,auVar24);
          auVar28._4_4_ = fVar180 * fVar149;
          auVar28._0_4_ = fVar176 * fVar145;
          auVar28._8_4_ = fVar182 * fVar150;
          auVar28._12_4_ = fVar184 * fVar151;
          auVar28._16_4_ = fVar186 * fVar152;
          auVar28._20_4_ = fVar188 * fVar153;
          auVar28._24_4_ = fVar190 * fVar154;
          auVar28._28_4_ = auVar71._28_4_ + local_b20._28_4_;
          auVar29._4_4_ = fVar97 * fVar110;
          auVar29._0_4_ = fVar90 * fVar105;
          auVar29._8_4_ = fVar98 * fVar111;
          auVar29._12_4_ = fVar99 * fVar112;
          auVar29._16_4_ = fVar100 * fVar113;
          auVar29._20_4_ = fVar101 * fVar114;
          auVar29._24_4_ = fVar103 * fVar115;
          auVar29._28_4_ = fVar82 + auVar20._28_4_;
          auVar24 = vsubps_avx(auVar29,auVar28);
          fVar105 = (ray->dir).field_0.m128[1];
          local_d40._4_4_ = fVar105;
          local_d40._0_4_ = fVar105;
          local_d40._8_4_ = fVar105;
          local_d40._12_4_ = fVar105;
          local_d40._16_4_ = fVar105;
          local_d40._20_4_ = fVar105;
          local_d40._24_4_ = fVar105;
          local_d40._28_4_ = fVar105;
          local_bc0._4_4_ = (ray->dir).field_0.m128[2];
          local_c60._4_4_ = (ray->dir).field_0.m128[0];
          local_be0._0_4_ =
               local_c60._4_4_ * auVar22._0_4_ +
               fVar105 * auVar23._0_4_ + local_bc0._4_4_ * auVar24._0_4_;
          local_be0._4_4_ =
               local_c60._4_4_ * auVar22._4_4_ +
               fVar105 * auVar23._4_4_ + local_bc0._4_4_ * auVar24._4_4_;
          local_be0._8_4_ =
               local_c60._4_4_ * auVar22._8_4_ +
               fVar105 * auVar23._8_4_ + local_bc0._4_4_ * auVar24._8_4_;
          local_be0._12_4_ =
               local_c60._4_4_ * auVar22._12_4_ +
               fVar105 * auVar23._12_4_ + local_bc0._4_4_ * auVar24._12_4_;
          local_be0._16_4_ =
               local_c60._4_4_ * auVar22._16_4_ +
               fVar105 * auVar23._16_4_ + local_bc0._4_4_ * auVar24._16_4_;
          local_be0._20_4_ =
               local_c60._4_4_ * auVar22._20_4_ +
               fVar105 * auVar23._20_4_ + local_bc0._4_4_ * auVar24._20_4_;
          local_be0._24_4_ =
               local_c60._4_4_ * auVar22._24_4_ +
               fVar105 * auVar23._24_4_ + local_bc0._4_4_ * auVar24._24_4_;
          local_be0._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar24._28_4_;
          auVar22 = vsubps_avx(local_b40,auVar79);
          local_a40 = vsubps_avx(local_b60,auVar19);
          fVar112 = fVar195 + auVar79._0_4_;
          fVar113 = fVar198 + auVar79._4_4_;
          fVar114 = fVar200 + auVar79._8_4_;
          fVar115 = fVar202 + auVar79._12_4_;
          fVar116 = fVar204 + auVar79._16_4_;
          fVar123 = fVar206 + auVar79._20_4_;
          fVar125 = fVar208 + auVar79._24_4_;
          fVar110 = auVar79._28_4_;
          fVar127 = fVar10 + auVar19._0_4_;
          fVar129 = fVar12 + auVar19._4_4_;
          fVar131 = fVar14 + auVar19._8_4_;
          fVar133 = fVar81 + auVar19._12_4_;
          fVar145 = fVar85 + auVar19._16_4_;
          fVar149 = fVar89 + auVar19._20_4_;
          fVar150 = fVar17 + auVar19._24_4_;
          fVar111 = auVar19._28_4_;
          fVar177 = local_a40._0_4_;
          fVar181 = local_a40._4_4_;
          auVar30._4_4_ = fVar181 * fVar113;
          auVar30._0_4_ = fVar177 * fVar112;
          fVar183 = local_a40._8_4_;
          auVar30._8_4_ = fVar183 * fVar114;
          fVar185 = local_a40._12_4_;
          auVar30._12_4_ = fVar185 * fVar115;
          fVar187 = local_a40._16_4_;
          auVar30._16_4_ = fVar187 * fVar116;
          fVar189 = local_a40._20_4_;
          auVar30._20_4_ = fVar189 * fVar123;
          fVar191 = local_a40._24_4_;
          auVar30._24_4_ = fVar191 * fVar125;
          auVar30._28_4_ = fVar82;
          fVar161 = auVar22._0_4_;
          fVar164 = auVar22._4_4_;
          auVar31._4_4_ = fVar164 * fVar129;
          auVar31._0_4_ = fVar161 * fVar127;
          fVar166 = auVar22._8_4_;
          auVar31._8_4_ = fVar166 * fVar131;
          fVar168 = auVar22._12_4_;
          auVar31._12_4_ = fVar168 * fVar133;
          fVar170 = auVar22._16_4_;
          auVar31._16_4_ = fVar170 * fVar145;
          fVar172 = auVar22._20_4_;
          auVar31._20_4_ = fVar172 * fVar149;
          fVar174 = auVar22._24_4_;
          auVar31._24_4_ = fVar174 * fVar150;
          auVar31._28_4_ = fVar111;
          auVar23 = vsubps_avx(auVar31,auVar30);
          auVar24 = vsubps_avx(local_b20,auVar70);
          fVar196 = auVar24._0_4_;
          fVar199 = auVar24._4_4_;
          auVar32._4_4_ = fVar199 * fVar129;
          auVar32._0_4_ = fVar196 * fVar127;
          fVar201 = auVar24._8_4_;
          auVar32._8_4_ = fVar201 * fVar131;
          fVar203 = auVar24._12_4_;
          auVar32._12_4_ = fVar203 * fVar133;
          fVar205 = auVar24._16_4_;
          auVar32._16_4_ = fVar205 * fVar145;
          fVar207 = auVar24._20_4_;
          auVar32._20_4_ = fVar207 * fVar149;
          fVar209 = auVar24._24_4_;
          auVar32._24_4_ = fVar209 * fVar150;
          auVar32._28_4_ = local_b60._28_4_ + fVar111;
          fVar127 = fVar11 + auVar70._0_4_;
          fVar129 = fVar13 + auVar70._4_4_;
          fVar131 = fVar15 + auVar70._8_4_;
          fVar133 = fVar83 + auVar70._12_4_;
          fVar145 = fVar87 + auVar70._16_4_;
          fVar149 = fVar16 + auVar70._20_4_;
          fVar150 = fVar18 + auVar70._24_4_;
          auVar33._4_4_ = fVar181 * fVar129;
          auVar33._0_4_ = fVar177 * fVar127;
          auVar33._8_4_ = fVar183 * fVar131;
          auVar33._12_4_ = fVar185 * fVar133;
          auVar33._16_4_ = fVar187 * fVar145;
          auVar33._20_4_ = fVar189 * fVar149;
          auVar33._24_4_ = fVar191 * fVar150;
          auVar33._28_4_ = local_a40._28_4_;
          auVar24 = vsubps_avx(auVar33,auVar32);
          auVar34._4_4_ = fVar164 * fVar129;
          auVar34._0_4_ = fVar161 * fVar127;
          auVar34._8_4_ = fVar166 * fVar131;
          auVar34._12_4_ = fVar168 * fVar133;
          auVar34._16_4_ = fVar170 * fVar145;
          auVar34._20_4_ = fVar172 * fVar149;
          auVar34._24_4_ = fVar174 * fVar150;
          auVar34._28_4_ = local_b20._28_4_ + auVar70._28_4_;
          auVar35._4_4_ = fVar199 * fVar113;
          auVar35._0_4_ = fVar196 * fVar112;
          auVar35._8_4_ = fVar201 * fVar114;
          auVar35._12_4_ = fVar203 * fVar115;
          auVar35._16_4_ = fVar205 * fVar116;
          auVar35._20_4_ = fVar207 * fVar123;
          auVar35._24_4_ = fVar209 * fVar125;
          auVar35._28_4_ = fVar82 + fVar110;
          auVar25 = vsubps_avx(auVar35,auVar34);
          local_a60._0_4_ =
               local_c60._4_4_ * auVar23._0_4_ +
               fVar105 * auVar24._0_4_ + local_bc0._4_4_ * auVar25._0_4_;
          local_a60._4_4_ =
               local_c60._4_4_ * auVar23._4_4_ +
               fVar105 * auVar24._4_4_ + local_bc0._4_4_ * auVar25._4_4_;
          local_a60._8_4_ =
               local_c60._4_4_ * auVar23._8_4_ +
               fVar105 * auVar24._8_4_ + local_bc0._4_4_ * auVar25._8_4_;
          local_a60._12_4_ =
               local_c60._4_4_ * auVar23._12_4_ +
               fVar105 * auVar24._12_4_ + local_bc0._4_4_ * auVar25._12_4_;
          local_a60._16_4_ =
               local_c60._4_4_ * auVar23._16_4_ +
               fVar105 * auVar24._16_4_ + local_bc0._4_4_ * auVar25._16_4_;
          local_a60._20_4_ =
               local_c60._4_4_ * auVar23._20_4_ +
               fVar105 * auVar24._20_4_ + local_bc0._4_4_ * auVar25._20_4_;
          local_a60._24_4_ =
               local_c60._4_4_ * auVar23._24_4_ +
               fVar105 * auVar24._24_4_ + local_bc0._4_4_ * auVar25._24_4_;
          local_a60._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar25._28_4_;
          auVar23 = vsubps_avx(auVar70,auVar71);
          fVar151 = auVar70._0_4_ + auVar71._0_4_;
          fVar152 = auVar70._4_4_ + auVar71._4_4_;
          fVar153 = auVar70._8_4_ + auVar71._8_4_;
          fVar154 = auVar70._12_4_ + auVar71._12_4_;
          fVar82 = auVar70._16_4_ + auVar71._16_4_;
          fVar84 = auVar70._20_4_ + auVar71._20_4_;
          fVar86 = auVar70._24_4_ + auVar71._24_4_;
          fVar88 = auVar70._28_4_ + auVar71._28_4_;
          local_ac0 = vsubps_avx(auVar79,auVar20);
          fVar127 = auVar79._0_4_ + auVar20._0_4_;
          fVar129 = auVar79._4_4_ + auVar20._4_4_;
          fVar131 = auVar79._8_4_ + auVar20._8_4_;
          fVar133 = auVar79._12_4_ + auVar20._12_4_;
          fVar145 = auVar79._16_4_ + auVar20._16_4_;
          fVar149 = auVar79._20_4_ + auVar20._20_4_;
          fVar150 = auVar79._24_4_ + auVar20._24_4_;
          auVar71 = vsubps_avx(auVar19,auVar21);
          fVar114 = auVar21._0_4_ + auVar19._0_4_;
          fVar115 = auVar21._4_4_ + auVar19._4_4_;
          fVar116 = auVar21._8_4_ + auVar19._8_4_;
          fVar123 = auVar21._12_4_ + auVar19._12_4_;
          fVar125 = auVar21._16_4_ + auVar19._16_4_;
          fVar102 = auVar21._20_4_ + auVar19._20_4_;
          fVar104 = auVar21._24_4_ + auVar19._24_4_;
          fVar117 = auVar71._0_4_;
          fVar124 = auVar71._4_4_;
          auVar19._4_4_ = fVar124 * fVar129;
          auVar19._0_4_ = fVar117 * fVar127;
          fVar126 = auVar71._8_4_;
          auVar19._8_4_ = fVar126 * fVar131;
          fVar128 = auVar71._12_4_;
          auVar19._12_4_ = fVar128 * fVar133;
          fVar130 = auVar71._16_4_;
          auVar19._16_4_ = fVar130 * fVar145;
          fVar132 = auVar71._20_4_;
          auVar19._20_4_ = fVar132 * fVar149;
          fVar134 = auVar71._24_4_;
          auVar19._24_4_ = fVar134 * fVar150;
          auVar19._28_4_ = auVar23._28_4_;
          fVar162 = local_ac0._0_4_;
          fVar165 = local_ac0._4_4_;
          auVar36._4_4_ = fVar165 * fVar115;
          auVar36._0_4_ = fVar162 * fVar114;
          fVar167 = local_ac0._8_4_;
          auVar36._8_4_ = fVar167 * fVar116;
          fVar169 = local_ac0._12_4_;
          auVar36._12_4_ = fVar169 * fVar123;
          fVar171 = local_ac0._16_4_;
          auVar36._16_4_ = fVar171 * fVar125;
          fVar173 = local_ac0._20_4_;
          auVar36._20_4_ = fVar173 * fVar102;
          fVar175 = local_ac0._24_4_;
          auVar36._24_4_ = fVar175 * fVar104;
          auVar36._28_4_ = fVar110;
          auVar70 = vsubps_avx(auVar36,auVar19);
          fVar112 = auVar23._0_4_;
          fVar113 = auVar23._4_4_;
          auVar37._4_4_ = fVar113 * fVar115;
          auVar37._0_4_ = fVar112 * fVar114;
          fVar114 = auVar23._8_4_;
          auVar37._8_4_ = fVar114 * fVar116;
          fVar115 = auVar23._12_4_;
          auVar37._12_4_ = fVar115 * fVar123;
          fVar116 = auVar23._16_4_;
          auVar37._16_4_ = fVar116 * fVar125;
          fVar123 = auVar23._20_4_;
          auVar37._20_4_ = fVar123 * fVar102;
          fVar125 = auVar23._24_4_;
          auVar37._24_4_ = fVar125 * fVar104;
          auVar37._28_4_ = auVar21._28_4_ + fVar111;
          auVar21._4_4_ = fVar124 * fVar152;
          auVar21._0_4_ = fVar117 * fVar151;
          auVar21._8_4_ = fVar126 * fVar153;
          auVar21._12_4_ = fVar128 * fVar154;
          auVar21._16_4_ = fVar130 * fVar82;
          auVar21._20_4_ = fVar132 * fVar84;
          auVar21._24_4_ = fVar134 * fVar86;
          auVar21._28_4_ = fVar110;
          auVar79 = vsubps_avx(auVar21,auVar37);
          auVar38._4_4_ = fVar165 * fVar152;
          auVar38._0_4_ = fVar162 * fVar151;
          auVar38._8_4_ = fVar167 * fVar153;
          auVar38._12_4_ = fVar169 * fVar154;
          auVar38._16_4_ = fVar171 * fVar82;
          auVar38._20_4_ = fVar173 * fVar84;
          auVar38._24_4_ = fVar175 * fVar86;
          auVar38._28_4_ = fVar88;
          auVar39._4_4_ = fVar113 * fVar129;
          auVar39._0_4_ = fVar112 * fVar127;
          auVar39._8_4_ = fVar114 * fVar131;
          auVar39._12_4_ = fVar115 * fVar133;
          auVar39._16_4_ = fVar116 * fVar145;
          auVar39._20_4_ = fVar123 * fVar149;
          auVar39._24_4_ = fVar125 * fVar150;
          auVar39._28_4_ = fVar110 + auVar20._28_4_;
          auVar19 = vsubps_avx(auVar39,auVar38);
          local_bc0._0_4_ = local_bc0._4_4_;
          fStack_bb8 = local_bc0._4_4_;
          fStack_bb4 = local_bc0._4_4_;
          fStack_bb0 = local_bc0._4_4_;
          fStack_bac = local_bc0._4_4_;
          fStack_ba8 = local_bc0._4_4_;
          fStack_ba4 = local_bc0._4_4_;
          local_c60._0_4_ = local_c60._4_4_;
          fStack_c58 = local_c60._4_4_;
          fStack_c54 = local_c60._4_4_;
          fStack_c50 = local_c60._4_4_;
          fStack_c4c = local_c60._4_4_;
          fStack_c48 = local_c60._4_4_;
          fStack_c44 = local_c60._4_4_;
          auVar76._0_4_ =
               local_c60._4_4_ * auVar70._0_4_ +
               fVar105 * auVar79._0_4_ + local_bc0._4_4_ * auVar19._0_4_;
          auVar76._4_4_ =
               local_c60._4_4_ * auVar70._4_4_ +
               fVar105 * auVar79._4_4_ + local_bc0._4_4_ * auVar19._4_4_;
          auVar76._8_4_ =
               local_c60._4_4_ * auVar70._8_4_ +
               fVar105 * auVar79._8_4_ + local_bc0._4_4_ * auVar19._8_4_;
          auVar76._12_4_ =
               local_c60._4_4_ * auVar70._12_4_ +
               fVar105 * auVar79._12_4_ + local_bc0._4_4_ * auVar19._12_4_;
          auVar76._16_4_ =
               local_c60._4_4_ * auVar70._16_4_ +
               fVar105 * auVar79._16_4_ + local_bc0._4_4_ * auVar19._16_4_;
          auVar76._20_4_ =
               local_c60._4_4_ * auVar70._20_4_ +
               fVar105 * auVar79._20_4_ + local_bc0._4_4_ * auVar19._20_4_;
          auVar76._24_4_ =
               local_c60._4_4_ * auVar70._24_4_ +
               fVar105 * auVar79._24_4_ + local_bc0._4_4_ * auVar19._24_4_;
          auVar76._28_4_ = fVar88 + fVar88 + auVar19._28_4_;
          local_aa0._0_4_ = auVar76._0_4_ + local_be0._0_4_ + local_a60._0_4_;
          local_aa0._4_4_ = auVar76._4_4_ + local_be0._4_4_ + local_a60._4_4_;
          local_aa0._8_4_ = auVar76._8_4_ + local_be0._8_4_ + local_a60._8_4_;
          local_aa0._12_4_ = auVar76._12_4_ + local_be0._12_4_ + local_a60._12_4_;
          local_aa0._16_4_ = auVar76._16_4_ + local_be0._16_4_ + local_a60._16_4_;
          local_aa0._20_4_ = auVar76._20_4_ + local_be0._20_4_ + local_a60._20_4_;
          local_aa0._24_4_ = auVar76._24_4_ + local_be0._24_4_ + local_a60._24_4_;
          local_aa0._28_4_ = auVar76._28_4_ + local_be0._28_4_ + local_a60._28_4_;
          auVar70 = vminps_avx(local_be0,local_a60);
          auVar70 = vminps_avx(auVar70,auVar76);
          auVar93._8_4_ = 0x7fffffff;
          auVar93._0_8_ = 0x7fffffff7fffffff;
          auVar93._12_4_ = 0x7fffffff;
          auVar93._16_4_ = 0x7fffffff;
          auVar93._20_4_ = 0x7fffffff;
          auVar93._24_4_ = 0x7fffffff;
          auVar93._28_4_ = 0x7fffffff;
          local_a80 = vandps_avx(local_aa0,auVar93);
          fVar110 = local_a80._0_4_ * 1.1920929e-07;
          fVar111 = local_a80._4_4_ * 1.1920929e-07;
          auVar20._4_4_ = fVar111;
          auVar20._0_4_ = fVar110;
          fVar127 = local_a80._8_4_ * 1.1920929e-07;
          auVar20._8_4_ = fVar127;
          fVar129 = local_a80._12_4_ * 1.1920929e-07;
          auVar20._12_4_ = fVar129;
          fVar131 = local_a80._16_4_ * 1.1920929e-07;
          auVar20._16_4_ = fVar131;
          fVar133 = local_a80._20_4_ * 1.1920929e-07;
          auVar20._20_4_ = fVar133;
          fVar145 = local_a80._24_4_ * 1.1920929e-07;
          auVar20._24_4_ = fVar145;
          auVar20._28_4_ = 0x34000000;
          auVar147._0_8_ = CONCAT44(fVar111,fVar110) ^ 0x8000000080000000;
          auVar147._8_4_ = -fVar127;
          auVar147._12_4_ = -fVar129;
          auVar147._16_4_ = -fVar131;
          auVar147._20_4_ = -fVar133;
          auVar147._24_4_ = -fVar145;
          auVar147._28_4_ = 0xb4000000;
          auVar70 = vcmpps_avx(auVar70,auVar147,5);
          auVar19 = vmaxps_avx(local_be0,local_a60);
          auVar79 = vmaxps_avx(auVar19,auVar76);
          auVar79 = vcmpps_avx(auVar79,auVar20,2);
          auVar79 = vorps_avx(auVar70,auVar79);
          auVar155._8_4_ = 0x3f800000;
          auVar155._0_8_ = 0x3f8000003f800000;
          auVar155._12_4_ = 0x3f800000;
          auVar155._16_4_ = 0x3f800000;
          auVar155._20_4_ = 0x3f800000;
          auVar155._24_4_ = 0x3f800000;
          auVar155._28_4_ = 0x3f800000;
          if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar79 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar79 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar79 >> 0x7f,0) == '\0') &&
                (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar79 >> 0xbf,0) == '\0') &&
              (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar79[0x1f]) {
LAB_00b797e9:
            auVar148 = ZEXT1664(local_c80);
            auVar156 = ZEXT1664(local_c90);
            auVar158 = ZEXT1664(local_ca0);
            auVar160 = ZEXT1664(local_cb0);
            auVar109 = ZEXT1664(local_cc0);
            auVar163 = ZEXT1664(local_cd0);
            auVar179 = ZEXT1664(local_ce0);
            auVar96 = ZEXT1664(local_cf0);
            auVar122 = ZEXT1664(local_d00);
            auVar138 = ZEXT1664(local_d10);
            auVar194 = ZEXT1664(local_d20);
          }
          else {
            auVar40._4_4_ = fVar164 * fVar139;
            auVar40._0_4_ = fVar161 * fVar135;
            auVar40._8_4_ = fVar166 * fVar140;
            auVar40._12_4_ = fVar168 * fVar141;
            auVar40._16_4_ = fVar170 * fVar142;
            auVar40._20_4_ = fVar172 * fVar143;
            auVar40._24_4_ = fVar174 * fVar144;
            auVar40._28_4_ = auVar70._28_4_;
            auVar41._4_4_ = fVar180 * fVar181;
            auVar41._0_4_ = fVar176 * fVar177;
            auVar41._8_4_ = fVar182 * fVar183;
            auVar41._12_4_ = fVar184 * fVar185;
            auVar41._16_4_ = fVar186 * fVar187;
            auVar41._20_4_ = fVar188 * fVar189;
            auVar41._24_4_ = fVar190 * fVar191;
            auVar41._28_4_ = 0x34000000;
            auVar20 = vsubps_avx(auVar41,auVar40);
            auVar42._4_4_ = fVar181 * fVar165;
            auVar42._0_4_ = fVar177 * fVar162;
            auVar42._8_4_ = fVar183 * fVar167;
            auVar42._12_4_ = fVar185 * fVar169;
            auVar42._16_4_ = fVar187 * fVar171;
            auVar42._20_4_ = fVar189 * fVar173;
            auVar42._24_4_ = fVar191 * fVar175;
            auVar42._28_4_ = auVar19._28_4_;
            auVar43._4_4_ = fVar164 * fVar124;
            auVar43._0_4_ = fVar161 * fVar117;
            auVar43._8_4_ = fVar166 * fVar126;
            auVar43._12_4_ = fVar168 * fVar128;
            auVar43._16_4_ = fVar170 * fVar130;
            auVar43._20_4_ = fVar172 * fVar132;
            auVar43._24_4_ = fVar174 * fVar134;
            auVar43._28_4_ = auVar22._28_4_;
            auVar21 = vsubps_avx(auVar43,auVar42);
            auVar108._8_4_ = 0x7fffffff;
            auVar108._0_8_ = 0x7fffffff7fffffff;
            auVar108._12_4_ = 0x7fffffff;
            auVar108._16_4_ = 0x7fffffff;
            auVar108._20_4_ = 0x7fffffff;
            auVar108._24_4_ = 0x7fffffff;
            auVar108._28_4_ = 0x7fffffff;
            auVar70 = vandps_avx(auVar40,auVar108);
            auVar19 = vandps_avx(auVar42,auVar108);
            auVar70 = vcmpps_avx(auVar70,auVar19,1);
            local_960 = vblendvps_avx(auVar21,auVar20,auVar70);
            auVar44._4_4_ = fVar199 * fVar124;
            auVar44._0_4_ = fVar196 * fVar117;
            auVar44._8_4_ = fVar201 * fVar126;
            auVar44._12_4_ = fVar203 * fVar128;
            auVar44._16_4_ = fVar205 * fVar130;
            auVar44._20_4_ = fVar207 * fVar132;
            auVar44._24_4_ = fVar209 * fVar134;
            auVar44._28_4_ = auVar70._28_4_;
            auVar45._4_4_ = fVar199 * fVar139;
            auVar45._0_4_ = fVar196 * fVar135;
            auVar45._8_4_ = fVar201 * fVar140;
            auVar45._12_4_ = fVar203 * fVar141;
            auVar45._16_4_ = fVar205 * fVar142;
            auVar45._20_4_ = fVar207 * fVar143;
            auVar45._24_4_ = fVar209 * fVar144;
            auVar45._28_4_ = auVar20._28_4_;
            auVar46._4_4_ = fVar97 * fVar181;
            auVar46._0_4_ = fVar90 * fVar177;
            auVar46._8_4_ = fVar98 * fVar183;
            auVar46._12_4_ = fVar99 * fVar185;
            auVar46._16_4_ = fVar100 * fVar187;
            auVar46._20_4_ = fVar101 * fVar189;
            auVar46._24_4_ = fVar103 * fVar191;
            auVar46._28_4_ = local_a20._28_4_;
            auVar20 = vsubps_avx(auVar45,auVar46);
            auVar47._4_4_ = fVar181 * fVar113;
            auVar47._0_4_ = fVar177 * fVar112;
            auVar47._8_4_ = fVar183 * fVar114;
            auVar47._12_4_ = fVar185 * fVar115;
            auVar47._16_4_ = fVar187 * fVar116;
            auVar47._20_4_ = fVar189 * fVar123;
            auVar47._24_4_ = fVar191 * fVar125;
            auVar47._28_4_ = auVar19._28_4_;
            auVar21 = vsubps_avx(auVar47,auVar44);
            auVar70 = vandps_avx(auVar46,auVar108);
            auVar19 = vandps_avx(auVar44,auVar108);
            auVar70 = vcmpps_avx(auVar70,auVar19,1);
            local_940 = vblendvps_avx(auVar21,auVar20,auVar70);
            auVar48._4_4_ = fVar164 * fVar113;
            auVar48._0_4_ = fVar161 * fVar112;
            auVar48._8_4_ = fVar166 * fVar114;
            auVar48._12_4_ = fVar168 * fVar115;
            auVar48._16_4_ = fVar170 * fVar116;
            auVar48._20_4_ = fVar172 * fVar123;
            auVar48._24_4_ = fVar174 * fVar125;
            auVar48._28_4_ = auVar70._28_4_;
            auVar49._4_4_ = fVar97 * fVar164;
            auVar49._0_4_ = fVar90 * fVar161;
            auVar49._8_4_ = fVar98 * fVar166;
            auVar49._12_4_ = fVar99 * fVar168;
            auVar49._16_4_ = fVar100 * fVar170;
            auVar49._20_4_ = fVar101 * fVar172;
            auVar49._24_4_ = fVar103 * fVar174;
            auVar49._28_4_ = auVar20._28_4_;
            auVar50._4_4_ = fVar180 * fVar199;
            auVar50._0_4_ = fVar176 * fVar196;
            auVar50._8_4_ = fVar182 * fVar201;
            auVar50._12_4_ = fVar184 * fVar203;
            auVar50._16_4_ = fVar186 * fVar205;
            auVar50._20_4_ = fVar188 * fVar207;
            auVar50._24_4_ = fVar190 * fVar209;
            auVar50._28_4_ = auVar71._28_4_;
            auVar51._4_4_ = fVar199 * fVar165;
            auVar51._0_4_ = fVar196 * fVar162;
            auVar51._8_4_ = fVar201 * fVar167;
            auVar51._12_4_ = fVar203 * fVar169;
            auVar51._16_4_ = fVar205 * fVar171;
            auVar51._20_4_ = fVar207 * fVar173;
            auVar51._24_4_ = fVar209 * fVar175;
            auVar51._28_4_ = auVar23._28_4_;
            auVar71 = vsubps_avx(auVar49,auVar50);
            auVar20 = vsubps_avx(auVar51,auVar48);
            auVar70 = vandps_avx(auVar50,auVar108);
            auVar19 = vandps_avx(auVar48,auVar108);
            auVar19 = vcmpps_avx(auVar70,auVar19,1);
            local_920 = vblendvps_avx(auVar20,auVar71,auVar19);
            auVar69 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
            fVar111 = local_920._0_4_;
            fVar112 = local_920._4_4_;
            fVar113 = local_920._8_4_;
            fVar114 = local_920._12_4_;
            fVar115 = local_920._16_4_;
            fVar116 = local_920._20_4_;
            fVar123 = local_920._24_4_;
            fVar149 = local_940._0_4_;
            fVar150 = local_940._4_4_;
            fVar151 = local_940._8_4_;
            fVar152 = local_940._12_4_;
            fVar153 = local_940._16_4_;
            fVar154 = local_940._20_4_;
            fVar82 = local_940._24_4_;
            fVar84 = local_960._0_4_;
            fVar86 = local_960._4_4_;
            fVar88 = local_960._8_4_;
            fVar90 = local_960._12_4_;
            fVar97 = local_960._16_4_;
            fVar98 = local_960._20_4_;
            fVar99 = local_960._24_4_;
            fVar110 = fVar84 * local_c60._4_4_ + fVar149 * fVar105 + fVar111 * local_bc0._4_4_;
            fVar125 = fVar86 * local_c60._4_4_ + fVar150 * fVar105 + fVar112 * local_bc0._4_4_;
            fVar127 = fVar88 * local_c60._4_4_ + fVar151 * fVar105 + fVar113 * local_bc0._4_4_;
            fVar129 = fVar90 * local_c60._4_4_ + fVar152 * fVar105 + fVar114 * local_bc0._4_4_;
            fVar131 = fVar97 * local_c60._4_4_ + fVar153 * fVar105 + fVar115 * local_bc0._4_4_;
            fVar133 = fVar98 * local_c60._4_4_ + fVar154 * fVar105 + fVar116 * local_bc0._4_4_;
            fVar105 = fVar99 * local_c60._4_4_ + fVar82 * fVar105 + fVar123 * local_bc0._4_4_;
            fVar145 = auVar71._28_4_ + auVar71._28_4_ + 0.0;
            auVar94._0_4_ = fVar110 + fVar110;
            auVar94._4_4_ = fVar125 + fVar125;
            auVar94._8_4_ = fVar127 + fVar127;
            auVar94._12_4_ = fVar129 + fVar129;
            auVar94._16_4_ = fVar131 + fVar131;
            auVar94._20_4_ = fVar133 + fVar133;
            auVar94._24_4_ = fVar105 + fVar105;
            auVar94._28_4_ = fVar145 + fVar145;
            fVar110 = auVar70._28_4_;
            auVar70 = vrcpps_avx(auVar94);
            fVar125 = fVar84 * fVar11 + fVar149 * fVar195 + fVar111 * fVar10;
            fVar127 = fVar86 * fVar13 + fVar150 * fVar198 + fVar112 * fVar12;
            fVar129 = fVar88 * fVar15 + fVar151 * fVar200 + fVar113 * fVar14;
            fVar81 = fVar90 * fVar83 + fVar152 * fVar202 + fVar114 * fVar81;
            fVar83 = fVar97 * fVar87 + fVar153 * fVar204 + fVar115 * fVar85;
            fVar85 = fVar98 * fVar16 + fVar154 * fVar206 + fVar116 * fVar89;
            fVar87 = fVar99 * fVar18 + fVar82 * fVar208 + fVar123 * fVar17;
            fVar89 = fVar110 + fVar110 + fVar145;
            fVar105 = auVar70._0_4_;
            fVar10 = auVar70._4_4_;
            auVar52._4_4_ = auVar94._4_4_ * fVar10;
            auVar52._0_4_ = auVar94._0_4_ * fVar105;
            fVar11 = auVar70._8_4_;
            auVar52._8_4_ = auVar94._8_4_ * fVar11;
            fVar12 = auVar70._12_4_;
            auVar52._12_4_ = auVar94._12_4_ * fVar12;
            fVar13 = auVar70._16_4_;
            auVar52._16_4_ = auVar94._16_4_ * fVar13;
            fVar14 = auVar70._20_4_;
            auVar52._20_4_ = auVar94._20_4_ * fVar14;
            fVar15 = auVar70._24_4_;
            auVar52._24_4_ = auVar94._24_4_ * fVar15;
            auVar52._28_4_ = fVar110;
            auVar70 = vsubps_avx(auVar155,auVar52);
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar136._4_4_ = uVar1;
            auVar136._0_4_ = uVar1;
            auVar136._8_4_ = uVar1;
            auVar136._12_4_ = uVar1;
            auVar136._16_4_ = uVar1;
            auVar136._20_4_ = uVar1;
            auVar136._24_4_ = uVar1;
            auVar136._28_4_ = uVar1;
            local_8a0._4_4_ = (fVar127 + fVar127) * (fVar10 + fVar10 * auVar70._4_4_);
            local_8a0._0_4_ = (fVar125 + fVar125) * (fVar105 + fVar105 * auVar70._0_4_);
            local_8a0._8_4_ = (fVar129 + fVar129) * (fVar11 + fVar11 * auVar70._8_4_);
            local_8a0._12_4_ = (fVar81 + fVar81) * (fVar12 + fVar12 * auVar70._12_4_);
            local_8a0._16_4_ = (fVar83 + fVar83) * (fVar13 + fVar13 * auVar70._16_4_);
            local_8a0._20_4_ = (fVar85 + fVar85) * (fVar14 + fVar14 * auVar70._20_4_);
            local_8a0._24_4_ = (fVar87 + fVar87) * (fVar15 + fVar15 * auVar70._24_4_);
            local_8a0._28_4_ = fVar89 + fVar89;
            auVar70 = vcmpps_avx(auVar136,local_8a0,2);
            fVar105 = ray->tfar;
            auVar137._4_4_ = fVar105;
            auVar137._0_4_ = fVar105;
            auVar137._8_4_ = fVar105;
            auVar137._12_4_ = fVar105;
            auVar137._16_4_ = fVar105;
            auVar137._20_4_ = fVar105;
            auVar137._24_4_ = fVar105;
            auVar137._28_4_ = fVar105;
            auVar79 = vcmpps_avx(local_8a0,auVar137,2);
            auVar70 = vandps_avx(auVar79,auVar70);
            auVar79 = vcmpps_avx(auVar94,_DAT_01f7b000,4);
            auVar70 = vandps_avx(auVar70,auVar79);
            auVar118 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
            auVar69 = vpand_avx(auVar118,auVar69);
            auVar118 = vpmovsxwd_avx(auVar69);
            auVar68 = vpshufd_avx(auVar69,0xee);
            auVar68 = vpmovsxwd_avx(auVar68);
            local_900._16_16_ = auVar68;
            local_900._0_16_ = auVar118;
            if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_900 >> 0x7f,0) == '\0') &&
                  (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar68 >> 0x3f,0) == '\0') &&
                (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar68[0xf]) goto LAB_00b797e9;
            local_d40._0_8_ = ray;
            local_bc0 = puVar64;
            local_9c0 = local_be0._0_4_;
            fStack_9bc = local_be0._4_4_;
            fStack_9b8 = local_be0._8_4_;
            fStack_9b4 = local_be0._12_4_;
            fStack_9b0 = local_be0._16_4_;
            fStack_9ac = local_be0._20_4_;
            fStack_9a8 = local_be0._24_4_;
            fStack_9a4 = local_be0._28_4_;
            local_9a0 = local_a60._0_4_;
            fStack_99c = local_a60._4_4_;
            fStack_998 = local_a60._8_4_;
            fStack_994 = local_a60._12_4_;
            fStack_990 = local_a60._16_4_;
            fStack_98c = local_a60._20_4_;
            fStack_988 = local_a60._24_4_;
            fStack_984 = local_a60._28_4_;
            local_980 = local_aa0;
            local_820 = local_ae0;
            auVar70 = vrcpps_avx(local_aa0);
            fVar105 = auVar70._0_4_;
            fVar10 = auVar70._4_4_;
            auVar53._4_4_ = local_aa0._4_4_ * fVar10;
            auVar53._0_4_ = local_aa0._0_4_ * fVar105;
            fVar11 = auVar70._8_4_;
            auVar53._8_4_ = local_aa0._8_4_ * fVar11;
            fVar12 = auVar70._12_4_;
            auVar53._12_4_ = local_aa0._12_4_ * fVar12;
            fVar13 = auVar70._16_4_;
            auVar53._16_4_ = local_aa0._16_4_ * fVar13;
            fVar14 = auVar70._20_4_;
            auVar53._20_4_ = local_aa0._20_4_ * fVar14;
            fVar15 = auVar70._24_4_;
            auVar53._24_4_ = local_aa0._24_4_ * fVar15;
            auVar53._28_4_ = auVar68._12_4_;
            auVar79 = vsubps_avx(auVar155,auVar53);
            auVar80._0_4_ = fVar105 + fVar105 * auVar79._0_4_;
            auVar80._4_4_ = fVar10 + fVar10 * auVar79._4_4_;
            auVar80._8_4_ = fVar11 + fVar11 * auVar79._8_4_;
            auVar80._12_4_ = fVar12 + fVar12 * auVar79._12_4_;
            auVar80._16_4_ = fVar13 + fVar13 * auVar79._16_4_;
            auVar80._20_4_ = fVar14 + fVar14 * auVar79._20_4_;
            auVar80._24_4_ = fVar15 + fVar15 * auVar79._24_4_;
            auVar80._28_4_ = auVar70._28_4_ + auVar79._28_4_;
            auVar95._8_4_ = 0x219392ef;
            auVar95._0_8_ = 0x219392ef219392ef;
            auVar95._12_4_ = 0x219392ef;
            auVar95._16_4_ = 0x219392ef;
            auVar95._20_4_ = 0x219392ef;
            auVar95._24_4_ = 0x219392ef;
            auVar95._28_4_ = 0x219392ef;
            auVar79 = vcmpps_avx(local_a80,auVar95,5);
            auVar70 = vandps_avx(auVar79,auVar80);
            auVar54._4_4_ = local_be0._4_4_ * auVar70._4_4_;
            auVar54._0_4_ = local_be0._0_4_ * auVar70._0_4_;
            auVar54._8_4_ = local_be0._8_4_ * auVar70._8_4_;
            auVar54._12_4_ = local_be0._12_4_ * auVar70._12_4_;
            auVar54._16_4_ = local_be0._16_4_ * auVar70._16_4_;
            auVar54._20_4_ = local_be0._20_4_ * auVar70._20_4_;
            auVar54._24_4_ = local_be0._24_4_ * auVar70._24_4_;
            auVar54._28_4_ = auVar79._28_4_;
            auVar79 = vminps_avx(auVar54,auVar155);
            auVar55._4_4_ = local_a60._4_4_ * auVar70._4_4_;
            auVar55._0_4_ = local_a60._0_4_ * auVar70._0_4_;
            auVar55._8_4_ = local_a60._8_4_ * auVar70._8_4_;
            auVar55._12_4_ = local_a60._12_4_ * auVar70._12_4_;
            auVar55._16_4_ = local_a60._16_4_ * auVar70._16_4_;
            auVar55._20_4_ = local_a60._20_4_ * auVar70._20_4_;
            auVar55._24_4_ = local_a60._24_4_ * auVar70._24_4_;
            auVar55._28_4_ = auVar70._28_4_;
            auVar70 = vminps_avx(auVar55,auVar155);
            auVar19 = vsubps_avx(auVar155,auVar79);
            auVar71 = vsubps_avx(auVar155,auVar70);
            local_8c0 = vblendvps_avx(auVar70,auVar19,local_ae0);
            local_8e0 = vblendvps_avx(auVar79,auVar71,local_ae0);
            local_880._4_4_ = fVar86 * (float)local_b00._4_4_;
            local_880._0_4_ = fVar84 * (float)local_b00._0_4_;
            local_880._8_4_ = fVar88 * fStack_af8;
            local_880._12_4_ = fVar90 * fStack_af4;
            local_880._16_4_ = fVar97 * fStack_af0;
            local_880._20_4_ = fVar98 * fStack_aec;
            local_880._24_4_ = fVar99 * fStack_ae8;
            local_880._28_4_ = local_8c0._28_4_;
            local_860[0] = fVar149 * (float)local_b00._0_4_;
            local_860[1] = fVar150 * (float)local_b00._4_4_;
            local_860[2] = fVar151 * fStack_af8;
            local_860[3] = fVar152 * fStack_af4;
            fStack_850 = fVar153 * fStack_af0;
            fStack_84c = fVar154 * fStack_aec;
            fStack_848 = fVar82 * fStack_ae8;
            uStack_844 = local_8e0._28_4_;
            local_840[0] = (float)local_b00._0_4_ * fVar111;
            local_840[1] = (float)local_b00._4_4_ * fVar112;
            local_840[2] = fStack_af8 * fVar113;
            local_840[3] = fStack_af4 * fVar114;
            fStack_830 = fStack_af0 * fVar115;
            fStack_82c = fStack_aec * fVar116;
            fStack_828 = fStack_ae8 * fVar123;
            uStack_824 = local_920._28_4_;
            auVar69 = vpsllw_avx(auVar69,0xf);
            auVar69 = vpacksswb_avx(auVar69,auVar69);
            uVar57 = (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 | (SUB161(auVar69 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar69 >> 0x3f,0) << 7);
            auVar148 = ZEXT1664(local_c80);
            auVar156 = ZEXT1664(local_c90);
            auVar158 = ZEXT1664(local_ca0);
            auVar160 = ZEXT1664(local_cb0);
            auVar109 = ZEXT1664(local_cc0);
            auVar163 = ZEXT1664(local_cd0);
            auVar179 = ZEXT1664(local_ce0);
            auVar96 = ZEXT1664(local_cf0);
            auVar122 = ZEXT1664(local_d00);
            auVar138 = ZEXT1664(local_d10);
            auVar194 = ZEXT1664(local_d20);
            local_a20 = auVar75;
            do {
              uVar59 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                }
              }
              local_c28 = *(uint *)((long)&local_9e0 + uVar59 * 4);
              pGVar8 = (pSVar63->geometries).items[local_c28].ptr;
              if ((pGVar8->mask & *(uint *)(local_d40._0_8_ + 0x24)) == 0) {
                uVar57 = uVar57 ^ 1L << (uVar59 & 0x3f);
              }
              else {
                local_c60 = uVar59;
                pRVar62 = context->args;
                if ((pRVar62->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b7986a;
                local_b40._0_8_ = uVar57;
                local_b20._0_8_ = uVar65;
                local_be0._0_8_ = context;
                local_c10.context = context->user;
                local_c40 = *(undefined4 *)(local_880 + uVar59 * 4);
                local_c3c = local_860[uVar59];
                local_c38 = local_840[uVar59];
                local_c34 = *(undefined4 *)(local_8e0 + uVar59 * 4);
                local_c30 = *(undefined4 *)(local_8c0 + uVar59 * 4);
                local_c2c = *(undefined4 *)((long)&local_a00 + uVar59 * 4);
                local_c24 = (local_c10.context)->instID[0];
                local_c20 = (local_c10.context)->instPrimID[0];
                local_b60._0_4_ = *(undefined4 *)(local_d40._0_8_ + 0x20);
                *(undefined4 *)(local_d40._0_8_ + 0x20) = *(undefined4 *)(local_8a0 + uVar59 * 4);
                local_d4c = -1;
                local_c10.valid = &local_d4c;
                local_c10.geometryUserPtr = pGVar8->userPtr;
                local_c10.ray = (RTCRayN *)local_d40._0_8_;
                local_c10.hit = (RTCHitN *)&local_c40;
                local_c10.N = 1;
                local_b80._0_8_ = pGVar8;
                if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b796ed:
                  if ((pRVar62->filter == (RTCFilterFunctionN)0x0) ||
                     (((pRVar62->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(local_b80._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00b7986a:
                    *(undefined4 *)(local_d40._0_8_ + 0x20) = 0xff800000;
                    return;
                  }
                  (*pRVar62->filter)(&local_c10);
                  if (*local_c10.valid != 0) goto LAB_00b7986a;
                }
                else {
                  local_ba0._0_8_ = pRVar62;
                  (*pGVar8->occlusionFilterN)(&local_c10);
                  pRVar62 = (RTCIntersectArguments *)local_ba0._0_8_;
                  if (*local_c10.valid != 0) goto LAB_00b796ed;
                }
                *(undefined4 *)(local_d40._0_8_ + 0x20) = local_b60._0_4_;
                uVar57 = local_b40._0_8_ ^ 1L << (local_c60 & 0x3f);
                auVar148 = ZEXT1664(local_c80);
                auVar156 = ZEXT1664(local_c90);
                auVar158 = ZEXT1664(local_ca0);
                auVar160 = ZEXT1664(local_cb0);
                auVar109 = ZEXT1664(local_cc0);
                auVar163 = ZEXT1664(local_cd0);
                auVar179 = ZEXT1664(local_ce0);
                auVar96 = ZEXT1664(local_cf0);
                auVar122 = ZEXT1664(local_d00);
                auVar138 = ZEXT1664(local_d10);
                auVar194 = ZEXT1664(local_d20);
                context = (RayQueryContext *)local_be0._0_8_;
                pSVar63 = local_d48;
                uVar65 = local_b20._0_8_;
              }
            } while (uVar57 != 0);
            ray = (Ray *)local_d40._0_8_;
            puVar64 = local_bc0;
          }
        }
        goto LAB_00b78d08;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }